

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertexTag __thiscall
ON_SubDVertex::SuggestedVertexTag
          (ON_SubDVertex *this,bool bApplyInputTagBias,bool bReturnBestGuessWhenInvalid)

{
  short sVar1;
  ulong uVar2;
  bool bVar3;
  ON_SubDVertexTag local_62;
  ON_SubDVertexTag local_5a;
  uint local_54;
  ON_SubDVertexTag local_41;
  ON_SubDVertexTag best_guess_tag;
  ON_SubDEdge *e;
  uint vei;
  uint edge_count;
  uint crease_count;
  uint interior_count;
  uint boundary_count;
  uint wire_count;
  bool bReturnBestGuessWhenInvalid_local;
  bool bApplyInputTagBias_local;
  ON_SubDVertex *this_local;
  
  interior_count = 0;
  crease_count = 0;
  edge_count = 0;
  vei = 0;
  if (this->m_edges == (ON_SubDEdgePtr *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = (uint)this->m_edge_count;
  }
  if (local_54 < 2) {
    this_local._7_1_ = Corner;
  }
  else {
    for (e._4_4_ = 0; e._4_4_ < local_54; e._4_4_ = e._4_4_ + 1) {
      uVar2 = this->m_edges[e._4_4_].m_ptr & 0xfffffffffffffff8;
      if (uVar2 != 0) {
        sVar1 = *(short *)(uVar2 + 100);
        if (sVar1 == 0) {
          interior_count = interior_count + 1;
          vei = vei + 1;
        }
        else if (sVar1 == 1) {
          crease_count = crease_count + 1;
          vei = vei + 1;
        }
        else {
          if (sVar1 != 2) {
            return Corner;
          }
          edge_count = edge_count + 1;
          if (*(char *)(uVar2 + 0x60) == '\x02') {
            vei = vei + 1;
          }
        }
      }
    }
    if (vei < 3) {
      if (interior_count == 0) {
        local_41 = Unset;
        if (vei == 0) {
          local_41 = bReturnBestGuessWhenInvalid;
          if (1 < edge_count) {
            return Smooth;
          }
        }
        else if (vei == 1) {
          if ((crease_count == 0) && (1 < edge_count)) {
            return Dart;
          }
          if (bReturnBestGuessWhenInvalid) {
            local_41 = Corner;
          }
        }
        else if (vei == 2) {
          if (((crease_count == 0) && (1 < edge_count)) || (crease_count == 2)) {
            bVar3 = false;
            if (bApplyInputTagBias) {
              bVar3 = this->m_vertex_tag == Corner;
            }
            local_62 = Corner;
            if (!bVar3) {
              local_62 = Crease;
            }
            return local_62;
          }
          if (bReturnBestGuessWhenInvalid) {
            local_41 = Corner;
          }
        }
        this_local._7_1_ = local_41;
      }
      else if (((interior_count == 2) && (crease_count == 0)) && (edge_count == 0)) {
        bVar3 = false;
        if (bApplyInputTagBias) {
          bVar3 = this->m_vertex_tag == Corner;
        }
        local_5a = Corner;
        if (!bVar3) {
          local_5a = Crease;
        }
        this_local._7_1_ = local_5a;
      }
      else {
        this_local._7_1_ = Corner;
      }
    }
    else {
      this_local._7_1_ = Corner;
    }
  }
  return this_local._7_1_;
}

Assistant:

ON_SubDVertexTag ON_SubDVertex::SuggestedVertexTag(
  bool bApplyInputTagBias,
  bool bReturnBestGuessWhenInvalid
) const
{
  unsigned wire_count = 0;
  unsigned boundary_count = 0;
  unsigned interior_count = 0;

  unsigned crease_count = 0;

  const unsigned edge_count = (nullptr != m_edges ? m_edge_count : 0U);
  if ( edge_count < 2)
    return ON_SubDVertexTag::Corner;

  for (unsigned vei = 0; vei < edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      continue;
    switch(e->m_face_count)
    {
    case 0:
      ++wire_count;
      ++crease_count;
      break;
    case 1:
      ++boundary_count;
      ++crease_count;
      break;
    case 2:
      ++interior_count;
      if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        ++crease_count;
      break;
    default: // nonmanifold edge
      return ON_SubDVertexTag::Corner;
      break;
    }
  }

  if (crease_count >= 3)
    return ON_SubDVertexTag::Corner;

  if (wire_count > 0)
  {
    if (2 == wire_count && 0 == boundary_count && 0 == interior_count)
      return (bApplyInputTagBias && ON_SubDVertexTag::Corner == m_vertex_tag) ? ON_SubDVertexTag::Corner : ON_SubDVertexTag::Crease;
    return ON_SubDVertexTag::Corner;
  }

  ON_SubDVertexTag best_guess_tag = ON_SubDVertexTag::Unset;
  // crease_count >= 3 handled above
  switch (crease_count)
  {
  case 0:
    if (interior_count >= 2)
      return ON_SubDVertexTag::Smooth;
    if (bReturnBestGuessWhenInvalid)
    {
      // can occur when there is a nullptr edge
      best_guess_tag = ON_SubDVertexTag::Smooth;
    }
    break;
  case 1:
    if (0 == boundary_count && interior_count >= 2)
      return ON_SubDVertexTag::Dart;
    if (bReturnBestGuessWhenInvalid)
    {
      // topology is far from valid and dart evaluation is very delicate. 
      // We need more boundary edges, but using corner will at least give a well defined vertex surface point.
      best_guess_tag = ON_SubDVertexTag::Corner;
    }
    break;
  case 2:
    if(  (0 == boundary_count && interior_count >= 2) || (2 == boundary_count) )
      return (bApplyInputTagBias && ON_SubDVertexTag::Corner == m_vertex_tag) ? ON_SubDVertexTag::Corner : ON_SubDVertexTag::Crease;
    if (bReturnBestGuessWhenInvalid)
    {
      // topology is far from valid and dart evaluation is very delicate. 
      // We need more boundary edges, but using corner will at least give a well defined vertex surface point.
      best_guess_tag = ON_SubDVertexTag::Corner;
    }
    break;
  }

  return best_guess_tag;
}